

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventpoint.cpp
# Opt level: O2

void QMutableEventPoint::update(QEventPoint *other,QEventPoint *target)

{
  double dVar1;
  undefined8 uVar2;
  QEventPointPrivate *pQVar3;
  qreal qVar4;
  bool bVar5;
  QEventPointPrivate *pQVar6;
  qint64 qVar7;
  long in_FS_OFFSET;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  QPointF local_38;
  QPointF local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  detach(target);
  pQVar3 = (other->d).d.ptr;
  if (pQVar3 == (QEventPointPrivate *)0x0) {
    pQVar6 = (target->d).d.ptr;
    pQVar6->pressure = 0.0;
  }
  else {
    dVar1 = pQVar3->pressure;
    pQVar6 = (target->d).d.ptr;
    pQVar6->pressure = dVar1;
    if (pQVar3->state == Released) {
      local_28.xp = (pQVar6->globalPos).xp;
      local_28.yp = (pQVar6->globalPos).yp;
      local_38.xp = (pQVar3->globalPos).xp;
      local_38.yp = (pQVar3->globalPos).yp;
      bVar5 = ::operator!=(&local_28,&local_38);
      if (bVar5) {
        pQVar3 = (target->d).d.ptr;
        if (pQVar3 == (QEventPointPrivate *)0x0) {
          uVar8 = 0;
          uVar9 = 0;
          uVar10 = 0;
          uVar11 = 0;
        }
        else {
          uVar8 = *(undefined4 *)&(pQVar3->globalPos).xp;
          uVar9 = *(undefined4 *)((long)&(pQVar3->globalPos).xp + 4);
          uVar10 = *(undefined4 *)&(pQVar3->globalPos).yp;
          uVar11 = *(undefined4 *)((long)&(pQVar3->globalPos).yp + 4);
        }
        *(undefined4 *)&(pQVar3->globalLastPos).xp = uVar8;
        *(undefined4 *)((long)&(pQVar3->globalLastPos).xp + 4) = uVar9;
        *(undefined4 *)&(pQVar3->globalLastPos).yp = uVar10;
        *(undefined4 *)((long)&(pQVar3->globalLastPos).yp + 4) = uVar11;
      }
      ((target->d).d.ptr)->pressure = 0.0;
      goto LAB_0029d516;
    }
    if (pQVar3->state == Pressed) {
      qVar4 = (pQVar3->globalPos).yp;
      (pQVar6->globalPressPos).xp = (pQVar3->globalPos).xp;
      (pQVar6->globalPressPos).yp = qVar4;
      qVar4 = (pQVar3->globalPos).yp;
      (pQVar6->globalLastPos).xp = (pQVar3->globalPos).xp;
      (pQVar6->globalLastPos).yp = qVar4;
      if (dVar1 < 0.0) {
        pQVar6->pressure = 1.0;
      }
      goto LAB_0029d516;
    }
  }
  local_28.xp = (pQVar6->globalPos).xp;
  local_28.yp = (pQVar6->globalPos).yp;
  if (pQVar3 == (QEventPointPrivate *)0x0) {
    uVar8 = 0;
    uVar9 = 0;
    uVar10 = 0;
    uVar11 = 0;
  }
  else {
    uVar8 = *(undefined4 *)&(pQVar3->globalPos).xp;
    uVar9 = *(undefined4 *)((long)&(pQVar3->globalPos).xp + 4);
    uVar10 = *(undefined4 *)&(pQVar3->globalPos).yp;
    uVar11 = *(undefined4 *)((long)&(pQVar3->globalPos).yp + 4);
  }
  local_38.xp = (qreal)CONCAT44(uVar9,uVar8);
  local_38.yp = (qreal)CONCAT44(uVar11,uVar10);
  bVar5 = ::operator!=(&local_28,&local_38);
  if (bVar5) {
    pQVar3 = (target->d).d.ptr;
    if (pQVar3 == (QEventPointPrivate *)0x0) {
      uVar8 = 0;
      uVar9 = 0;
      uVar10 = 0;
      uVar11 = 0;
    }
    else {
      uVar8 = *(undefined4 *)&(pQVar3->globalPos).xp;
      uVar9 = *(undefined4 *)((long)&(pQVar3->globalPos).xp + 4);
      uVar10 = *(undefined4 *)&(pQVar3->globalPos).yp;
      uVar11 = *(undefined4 *)((long)&(pQVar3->globalPos).yp + 4);
    }
    *(undefined4 *)&(pQVar3->globalLastPos).xp = uVar8;
    *(undefined4 *)((long)&(pQVar3->globalLastPos).xp + 4) = uVar9;
    *(undefined4 *)&(pQVar3->globalLastPos).yp = uVar10;
    *(undefined4 *)((long)&(pQVar3->globalLastPos).yp + 4) = uVar11;
  }
  pQVar3 = (target->d).d.ptr;
  if ((pQVar3 != (QEventPointPrivate *)0x0) && (pQVar3->pressure <= 0.0 && pQVar3->pressure != 0.0))
  {
    pQVar3->pressure = 1.0;
  }
LAB_0029d516:
  pQVar3 = (other->d).d.ptr;
  if (pQVar3 == (QEventPointPrivate *)0x0) {
    pQVar6 = (target->d).d.ptr;
    pQVar6->state = Unknown;
    uVar8 = 0;
    uVar9 = 0;
    (pQVar6->pos).xp = 0.0;
    (pQVar6->pos).yp = 0.0;
    (pQVar6->scenePos).xp = 0.0;
    (pQVar6->scenePos).yp = 0.0;
    (pQVar6->globalPos).xp = 0.0;
    (pQVar6->globalPos).yp = 0.0;
    (pQVar6->ellipseDiameters).ht = -1.0;
    *(undefined4 *)&pQVar6->rotation = 0;
    *(undefined4 *)((long)&pQVar6->rotation + 4) = 0;
    *(undefined4 *)&(pQVar6->ellipseDiameters).wd = 0;
    *(undefined4 *)((long)&(pQVar6->ellipseDiameters).wd + 4) = 0xbff00000;
  }
  else {
    pQVar6 = (target->d).d.ptr;
    pQVar6->state = pQVar3->state;
    qVar4 = (pQVar3->pos).yp;
    (pQVar6->pos).xp = (pQVar3->pos).xp;
    (pQVar6->pos).yp = qVar4;
    qVar4 = (pQVar3->scenePos).yp;
    (pQVar6->scenePos).xp = (pQVar3->scenePos).xp;
    (pQVar6->scenePos).yp = qVar4;
    qVar4 = (pQVar3->globalPos).yp;
    (pQVar6->globalPos).xp = (pQVar3->globalPos).xp;
    (pQVar6->globalPos).yp = qVar4;
    qVar4 = (pQVar3->ellipseDiameters).ht;
    (pQVar6->ellipseDiameters).wd = (pQVar3->ellipseDiameters).wd;
    (pQVar6->ellipseDiameters).ht = qVar4;
    pQVar6->rotation = pQVar3->rotation;
    uVar2 = *(undefined8 *)(pQVar3->velocity).v;
    uVar8 = (undefined4)uVar2;
    uVar9 = (undefined4)((ulong)uVar2 >> 0x20);
  }
  *(ulong *)(pQVar6->velocity).v = CONCAT44(uVar9,uVar8);
  pQVar3 = (other->d).d.ptr;
  if (pQVar3 == (QEventPointPrivate *)0x0) {
    qVar7 = -1;
  }
  else {
    qVar7 = (pQVar3->uniqueId).m_numericId;
  }
  (((target->d).d.ptr)->uniqueId).m_numericId = qVar7;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMutableEventPoint::update(const QEventPoint &other, QEventPoint &target)
{
    detach(target);
    setPressure(target, other.pressure());

    switch (other.state()) {
    case QEventPoint::State::Pressed:
        setGlobalPressPosition(target, other.globalPosition());
        setGlobalLastPosition(target, other.globalPosition());
        if (target.pressure() < 0)
            setPressure(target, 1);
        break;

    case QEventPoint::State::Released:
        if (target.globalPosition() != other.globalPosition())
            setGlobalLastPosition(target, target.globalPosition());
        setPressure(target, 0);
        break;

    default: // update or stationary
        if (target.globalPosition() != other.globalPosition())
            setGlobalLastPosition(target, target.globalPosition());
        if (target.pressure() < 0)
            setPressure(target, 1);
        break;
    }

    setState(target, other.state());
    setPosition(target, other.position());
    setScenePosition(target, other.scenePosition());
    setGlobalPosition(target, other.globalPosition());
    setEllipseDiameters(target, other.ellipseDiameters());
    setRotation(target, other.rotation());
    setVelocity(target, other.velocity());
    setUniqueId(target, other.uniqueId()); // for TUIO
}